

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

uint64_t avx2_harley_seal_popcount256(__m256i *data,uint64_t size)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  ulong uVar7;
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [64];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [64];
  undefined1 auVar17 [32];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  
  auVar12 = ZEXT1664((undefined1  [16])0x0);
  uVar7 = 0;
  auVar8[8] = 0xf;
  auVar8._0_8_ = 0xf0f0f0f0f0f0f0f;
  auVar8[9] = 0xf;
  auVar8[10] = 0xf;
  auVar8[0xb] = 0xf;
  auVar8[0xc] = 0xf;
  auVar8[0xd] = 0xf;
  auVar8[0xe] = 0xf;
  auVar8[0xf] = 0xf;
  auVar8[0x10] = 0xf;
  auVar8[0x11] = 0xf;
  auVar8[0x12] = 0xf;
  auVar8[0x13] = 0xf;
  auVar8[0x14] = 0xf;
  auVar8[0x15] = 0xf;
  auVar8[0x16] = 0xf;
  auVar8[0x17] = 0xf;
  auVar8[0x18] = 0xf;
  auVar8[0x19] = 0xf;
  auVar8[0x1a] = 0xf;
  auVar8[0x1b] = 0xf;
  auVar8[0x1c] = 0xf;
  auVar8[0x1d] = 0xf;
  auVar8[0x1e] = 0xf;
  auVar8[0x1f] = 0xf;
  auVar10._16_16_ = _DAT_0011d140;
  auVar10._0_16_ = _DAT_0011d140;
  auVar9._16_16_ = _DAT_0011d150;
  auVar9._0_16_ = _DAT_0011d150;
  auVar18 = ZEXT1664((undefined1  [16])0x0);
  auVar20 = ZEXT1664((undefined1  [16])0x0);
  auVar19 = ZEXT1664((undefined1  [16])0x0);
  auVar16 = ZEXT1664((undefined1  [16])0x0);
  while( true ) {
    auVar11 = auVar12._0_32_;
    auVar17 = auVar18._0_32_;
    auVar15 = auVar20._0_32_;
    auVar22 = auVar19._0_32_;
    if (0xff < uVar7) break;
    auVar14 = vlddqu_avx((undefined1  [32])*data);
    auVar13 = vlddqu_avx((undefined1  [32])data[1]);
    auVar21 = vpand_avx2(auVar14,auVar22);
    auVar3 = vpand_avx2(auVar14 ^ auVar22,auVar13);
    auVar21 = vpor_avx2(auVar3,auVar21);
    auVar13 = auVar14 ^ auVar22 ^ auVar13;
    auVar22 = vlddqu_avx((undefined1  [32])data[2]);
    auVar14 = vlddqu_avx((undefined1  [32])data[3]);
    auVar4 = auVar13 ^ auVar22;
    auVar22 = vpand_avx2(auVar13,auVar22);
    auVar13 = vpand_avx2(auVar4,auVar14);
    auVar13 = vpor_avx2(auVar13,auVar22);
    auVar4 = auVar4 ^ auVar14;
    auVar22 = vpand_avx2(auVar21,auVar15);
    auVar14 = vpand_avx2(auVar13,auVar21 ^ auVar15);
    auVar3 = vpor_avx2(auVar14,auVar22);
    auVar13 = auVar13 ^ auVar21 ^ auVar15;
    auVar22 = vlddqu_avx((undefined1  [32])data[4]);
    auVar15 = vlddqu_avx((undefined1  [32])data[5]);
    auVar5 = auVar4 ^ auVar22;
    auVar22 = vpand_avx2(auVar4,auVar22);
    auVar14 = vpand_avx2(auVar5,auVar15);
    auVar21 = vpor_avx2(auVar14,auVar22);
    auVar5 = auVar5 ^ auVar15;
    auVar22 = vlddqu_avx((undefined1  [32])data[6]);
    auVar15 = vlddqu_avx((undefined1  [32])data[7]);
    auVar4 = auVar5 ^ auVar22;
    auVar22 = vpand_avx2(auVar5,auVar22);
    auVar14 = vpand_avx2(auVar4,auVar15);
    auVar14 = vpor_avx2(auVar14,auVar22);
    auVar4 = auVar4 ^ auVar15;
    auVar5 = auVar21 ^ auVar13;
    auVar22 = vpand_avx2(auVar21,auVar13);
    auVar15 = vpand_avx2(auVar14,auVar5);
    auVar13 = vpor_avx2(auVar15,auVar22);
    auVar14 = auVar14 ^ auVar5;
    auVar22 = vpand_avx2(auVar3,auVar17);
    auVar15 = vpand_avx2(auVar3 ^ auVar17,auVar13);
    auVar21 = vpor_avx2(auVar15,auVar22);
    auVar13 = auVar3 ^ auVar17 ^ auVar13;
    auVar17 = vlddqu_avx((undefined1  [32])data[8]);
    auVar22 = vlddqu_avx((undefined1  [32])data[9]);
    auVar5 = auVar4 ^ auVar17;
    auVar17 = vpand_avx2(auVar4,auVar17);
    auVar15 = vpand_avx2(auVar5,auVar22);
    auVar3 = vpor_avx2(auVar15,auVar17);
    auVar5 = auVar5 ^ auVar22;
    auVar17 = vlddqu_avx((undefined1  [32])data[10]);
    auVar22 = vlddqu_avx((undefined1  [32])data[0xb]);
    auVar4 = auVar17 ^ auVar5;
    auVar17 = vpand_avx2(auVar17,auVar5);
    auVar15 = vpand_avx2(auVar4,auVar22);
    auVar15 = vpor_avx2(auVar15,auVar17);
    auVar4 = auVar4 ^ auVar22;
    auVar5 = auVar14 ^ auVar3;
    auVar17 = vpand_avx2(auVar14,auVar3);
    auVar22 = vpand_avx2(auVar5,auVar15);
    auVar14 = vpor_avx2(auVar22,auVar17);
    auVar5 = auVar5 ^ auVar15;
    auVar17 = vlddqu_avx((undefined1  [32])data[0xc]);
    auVar22 = vlddqu_avx((undefined1  [32])data[0xd]);
    auVar6 = auVar4 ^ auVar17;
    auVar17 = vpand_avx2(auVar4,auVar17);
    auVar15 = vpand_avx2(auVar6,auVar22);
    auVar3 = vpor_avx2(auVar15,auVar17);
    auVar6 = auVar6 ^ auVar22;
    auVar17 = vlddqu_avx((undefined1  [32])data[0xe]);
    auVar22 = vlddqu_avx((undefined1  [32])data[0xf]);
    auVar4 = auVar17 ^ auVar6;
    auVar17 = vpand_avx2(auVar17,auVar6);
    auVar15 = vpand_avx2(auVar4,auVar22);
    auVar15 = vpor_avx2(auVar15,auVar17);
    auVar19 = ZEXT3264(auVar4 ^ auVar22);
    auVar4 = auVar3 ^ auVar5;
    auVar17 = vpand_avx2(auVar3,auVar5);
    auVar22 = vpand_avx2(auVar15,auVar4);
    auVar3 = vpor_avx2(auVar22,auVar17);
    auVar20 = ZEXT3264(auVar15 ^ auVar4);
    auVar4 = auVar14 ^ auVar13;
    auVar17 = vpand_avx2(auVar14,auVar13);
    auVar22 = vpand_avx2(auVar3,auVar4);
    auVar15 = vpor_avx2(auVar22,auVar17);
    auVar18 = ZEXT3264(auVar3 ^ auVar4);
    auVar17 = vpand_avx2(auVar21,auVar11);
    auVar22 = vpand_avx2(auVar15,auVar21 ^ auVar11);
    auVar17 = vpor_avx2(auVar22,auVar17);
    auVar12 = ZEXT3264(auVar15 ^ auVar21 ^ auVar11);
    auVar22 = vpsrlw_avx2(auVar17,4);
    auVar11 = vpand_avx2(auVar17,auVar8);
    auVar17 = vpshufb_avx2(auVar10,auVar11);
    auVar11 = vpand_avx2(auVar22,auVar8);
    auVar11 = vpshufb_avx2(auVar9,auVar11);
    auVar11 = vpsadbw_avx2(auVar17,auVar11);
    auVar11 = vpaddq_avx2(auVar11,auVar16._0_32_);
    auVar16 = ZEXT3264(auVar11);
    uVar7 = uVar7 + 0x10;
    data = data + 0x10;
  }
  auVar13 = vpsllq_avx2(auVar16._0_32_,4);
  auVar21 = vpsrlw_avx2(auVar11,4);
  auVar11 = vpand_avx2(auVar11,auVar8);
  auVar14 = vpshufb_avx2(auVar10,auVar11);
  auVar11 = vpand_avx2(auVar21,auVar8);
  auVar11 = vpshufb_avx2(auVar9,auVar11);
  auVar11 = vpsadbw_avx2(auVar11,auVar14);
  auVar11 = vpsllq_avx2(auVar11,3);
  auVar11 = vpaddq_avx2(auVar11,auVar13);
  auVar13 = vpsrlw_avx2(auVar17,4);
  auVar17 = vpand_avx2(auVar17,auVar8);
  auVar14 = vpshufb_avx2(auVar10,auVar17);
  auVar17 = vpand_avx2(auVar13,auVar8);
  auVar17 = vpshufb_avx2(auVar9,auVar17);
  auVar17 = vpsadbw_avx2(auVar14,auVar17);
  auVar14 = vpsllq_avx2(auVar17,2);
  auVar13 = vpsrlw_avx2(auVar15,4);
  auVar17 = vpand_avx2(auVar15,auVar8);
  auVar15 = vpshufb_avx2(auVar10,auVar17);
  auVar17 = vpand_avx2(auVar13,auVar8);
  auVar17 = vpshufb_avx2(auVar9,auVar17);
  auVar17 = vpsadbw_avx2(auVar15,auVar17);
  auVar17 = vpaddq_avx2(auVar17,auVar17);
  auVar17 = vpaddq_avx2(auVar14,auVar17);
  auVar11 = vpaddq_avx2(auVar11,auVar17);
  auVar15 = vpsrlw_avx2(auVar22,4);
  auVar17 = vpand_avx2(auVar22,auVar8);
  auVar10 = vpshufb_avx2(auVar10,auVar17);
  auVar8 = vpand_avx2(auVar15,auVar8);
  auVar8 = vpshufb_avx2(auVar9,auVar8);
  auVar8 = vpsadbw_avx2(auVar10,auVar8);
  auVar8 = vpaddq_avx2(auVar11,auVar8);
  auVar1 = vpaddq_avx(auVar8._0_16_,auVar8._16_16_);
  auVar2 = vpshufd_avx(auVar1,0xee);
  auVar1 = vpaddq_avx(auVar1,auVar2);
  return auVar1._0_8_;
}

Assistant:

inline static uint64_t avx2_harley_seal_popcount256(const __m256i *data,
                                                    const uint64_t size) {
    __m256i total = _mm256_setzero_si256();
    __m256i ones = _mm256_setzero_si256();
    __m256i twos = _mm256_setzero_si256();
    __m256i fours = _mm256_setzero_si256();
    __m256i eights = _mm256_setzero_si256();
    __m256i sixteens = _mm256_setzero_si256();
    __m256i twosA, twosB, foursA, foursB, eightsA, eightsB;

    const uint64_t limit = size - size % 16;
    uint64_t i = 0;

    for (; i < limit; i += 16) {
        CSA(&twosA, &ones, ones, _mm256_lddqu_si256(data + i),
            _mm256_lddqu_si256(data + i + 1));
        CSA(&twosB, &ones, ones, _mm256_lddqu_si256(data + i + 2),
            _mm256_lddqu_si256(data + i + 3));
        CSA(&foursA, &twos, twos, twosA, twosB);
        CSA(&twosA, &ones, ones, _mm256_lddqu_si256(data + i + 4),
            _mm256_lddqu_si256(data + i + 5));
        CSA(&twosB, &ones, ones, _mm256_lddqu_si256(data + i + 6),
            _mm256_lddqu_si256(data + i + 7));
        CSA(&foursB, &twos, twos, twosA, twosB);
        CSA(&eightsA, &fours, fours, foursA, foursB);
        CSA(&twosA, &ones, ones, _mm256_lddqu_si256(data + i + 8),
            _mm256_lddqu_si256(data + i + 9));
        CSA(&twosB, &ones, ones, _mm256_lddqu_si256(data + i + 10),
            _mm256_lddqu_si256(data + i + 11));
        CSA(&foursA, &twos, twos, twosA, twosB);
        CSA(&twosA, &ones, ones, _mm256_lddqu_si256(data + i + 12),
            _mm256_lddqu_si256(data + i + 13));
        CSA(&twosB, &ones, ones, _mm256_lddqu_si256(data + i + 14),
            _mm256_lddqu_si256(data + i + 15));
        CSA(&foursB, &twos, twos, twosA, twosB);
        CSA(&eightsB, &fours, fours, foursA, foursB);
        CSA(&sixteens, &eights, eights, eightsA, eightsB);

        total = _mm256_add_epi64(total, popcount256(sixteens));
    }

    total = _mm256_slli_epi64(total, 4);  // * 16
    total = _mm256_add_epi64(
        total, _mm256_slli_epi64(popcount256(eights), 3));  // += 8 * ...
    total = _mm256_add_epi64(
        total, _mm256_slli_epi64(popcount256(fours), 2));  // += 4 * ...
    total = _mm256_add_epi64(
        total, _mm256_slli_epi64(popcount256(twos), 1));  // += 2 * ...
    total = _mm256_add_epi64(total, popcount256(ones));
    for (; i < size; i++)
        total =
            _mm256_add_epi64(total, popcount256(_mm256_lddqu_si256(data + i)));

    return (uint64_t)(_mm256_extract_epi64(total, 0)) +
           (uint64_t)(_mm256_extract_epi64(total, 1)) +
           (uint64_t)(_mm256_extract_epi64(total, 2)) +
           (uint64_t)(_mm256_extract_epi64(total, 3));
}